

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeGravityForceScale(ChElementHexaANCF_3813_9 *this)

{
  ChVectorN<double,_11> *this_00;
  double local_30;
  Brick9_Gravity myformula;
  
  this_00 = &this->m_GravForceScale;
  myformula.super_ChIntegrable3D<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>._vptr_ChIntegrable3D =
       (_func_int **)&PTR__ChIntegrable3D_01181d00;
  myformula.m_element = this;
  Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)this_00);
  ChQuadrature::Integrate3D<Eigen::Matrix<double,11,1,0,11,1>>
            (this_00,&myformula.super_ChIntegrable3D<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>,-1.0,
             1.0,-1.0,1.0,-1.0,1.0,2);
  local_30 = (((this->m_material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ChContinuumMaterial).density;
  Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)this_00,&local_30);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeGravityForceScale() {
    Brick9_Gravity myformula(this);

    m_GravForceScale.setZero();
    ChQuadrature::Integrate3D<ChVectorN<double, 11>>(m_GravForceScale,  // result of integration will go there
                                                     myformula,         // formula to integrate
                                                     -1, 1,             // limits in x direction
                                                     -1, 1,             // limits in y direction
                                                     -1, 1,             // limits in z direction
                                                     2                  // order of integration
    );

    m_GravForceScale *= m_material->Get_density();
}